

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

size_t __thiscall TxaHeader::updateAndCalcBinSize(TxaHeader *this)

{
  bool bVar1;
  pointer pTVar2;
  TxaChunk *chunk;
  pointer pTVar3;
  string local_50;
  
  bVar1 = this->isSwitch;
  this->largestDecodedChunk = 0;
  this->indexSize = 0;
  pTVar3 = (this->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (this->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pTVar3 == pTVar2) break;
    this->indexSize = this->indexSize + (uint)bVar1 * 4 + 0x10;
    fromUTF8(&local_50,&pTVar3->name);
    this->indexSize = ((uint)local_50._M_string_length & 0xfffffffc) + this->indexSize + 4;
    std::__cxx11::string::~string((string *)&local_50);
    if (this->largestDecodedChunk < pTVar3->decodedLength) {
      this->largestDecodedChunk = pTVar3->decodedLength;
    }
    pTVar3 = pTVar3 + 1;
  }
  return (ulong)this->indexSize + 0x20;
}

Assistant:

size_t TxaHeader::updateAndCalcBinSize() {
	size_t size = isSwitch ? sizeof(TxaHeaderSwitch) : sizeof(TxaHeaderPS3);
	size_t chunksize = isSwitch ? sizeof(TxaChunkSwitch) : sizeof(TxaChunkPS3);
	indexSize = 0;
	largestDecodedChunk = 0;

	for (const auto& chunk : chunks) {
		indexSize += chunksize;
		indexSize += align(fromUTF8(chunk.name).size() + 1, 4);
		if (chunk.decodedLength > largestDecodedChunk) {
			largestDecodedChunk = chunk.decodedLength;
		}
	}

	return size + indexSize;
}